

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeHelpers.hpp
# Opt level: O1

SoapySDRKwargs * toKwargs(SoapySDRKwargs *__return_storage_ptr__,Kwargs *args)

{
  int iVar1;
  _Rb_tree_node_base *p_Var2;
  undefined8 *puVar3;
  
  __return_storage_ptr__->size = 0;
  __return_storage_ptr__->keys = (char **)0x0;
  __return_storage_ptr__->vals = (char **)0x0;
  p_Var2 = (args->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    if ((_Rb_tree_header *)p_Var2 == &(args->_M_t)._M_impl.super__Rb_tree_header) {
      return __return_storage_ptr__;
    }
    iVar1 = SoapySDRKwargs_set(__return_storage_ptr__,*(char **)(p_Var2 + 1),*(char **)(p_Var2 + 2))
    ;
    if (iVar1 != 0) break;
    p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2);
  }
  puVar3 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar3 = __cxa_init_primary_exception;
  __cxa_throw(puVar3,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

static inline SoapySDRKwargs toKwargs(const SoapySDR::Kwargs &args)
{
    SoapySDRKwargs out;
    std::memset(&out, 0, sizeof(out));
    for (const auto &it : args)
    {
        if (SoapySDRKwargs_set(&out, it.first.c_str(), it.second.c_str()) != 0)
        {
            throw std::bad_alloc();
        }
    }
    return out;
}